

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O1

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* dgrminer::combinations
            (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *__return_storage_ptr__,vector<int,_std::allocator<int>_> *input,
            size_t combination_size)

{
  bool bVar1;
  size_t sVar2;
  pointer piVar3;
  ulong *puVar4;
  ulong *puVar5;
  long lVar6;
  ulong uVar7;
  vector<bool,_std::allocator<bool>_> v;
  vector<int,_std::allocator<int>_> result;
  allocator_type local_71;
  vector<bool,_std::allocator<bool>_> local_70;
  void *local_48;
  iterator iStack_40;
  int *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = (void *)((ulong)local_48 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_70,
             (long)(input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,(bool *)&local_48,&local_71);
  sVar2 = combination_size + 0x3f;
  if (-1 < (long)combination_size) {
    sVar2 = combination_size;
  }
  puVar4 = local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p +
           ((long)sVar2 >> 6) +
           ((ulong)((combination_size & 0x800000000000003f) < 0x8000000000000001) - 1);
  puVar5 = local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  if (local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != puVar4) {
    memset(local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p,0xff,
           (long)puVar4 -
           (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    puVar5 = puVar4;
  }
  if ((combination_size & 0x3f) != 0) {
    *puVar5 = *puVar5 | 0xffffffffffffffffU >> (-((byte)combination_size & 0x3f) & 0x3f);
  }
  do {
    local_48 = (void *)0x0;
    iStack_40._M_current = (int *)0x0;
    local_38 = (int *)0x0;
    piVar3 = (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if ((input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish != piVar3) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        if ((local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0) {
          if (iStack_40._M_current == local_38) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_48,iStack_40,
                       (int *)((long)piVar3 + lVar6));
          }
          else {
            *iStack_40._M_current = *(int *)((long)piVar3 + lVar6);
            iStack_40._M_current = iStack_40._M_current + 1;
          }
        }
        uVar7 = uVar7 + 1;
        piVar3 = (input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar6 = lVar6 + 4;
      } while (uVar7 < (ulong)((long)(input->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_finish - (long)piVar3 >> 2));
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_48);
    if (local_48 != (void *)0x0) {
      operator_delete(local_48);
    }
    bVar1 = std::__prev_permutation<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,0,
                       local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                       local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset);
  } while (bVar1);
  if (local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<std::vector<int>> combinations(
		const std::vector<int>& input,
		size_t combination_size
	) {
	  	std::vector<std::vector<int>> results;
	  	std::vector<bool> v(input.size());
	  	std::fill(v.begin(), v.begin() + combination_size, true);

	  	do {
			std::vector<int> result;
			for (int i = 0; i < input.size(); ++i) {
		  		if (v[i]) {
					result.push_back(input[i]);
				}
		  	}
			results.push_back(result);
		} while (std::prev_permutation(v.begin(), v.end()));

	  	return results;
	}